

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O2

QSharedPointer<QIconCacheGtkReader> __thiscall
QSharedPointer<QIconCacheGtkReader>::create<QString&>
          (QSharedPointer<QIconCacheGtkReader> *this,QString *arguments)

{
  ExternalRefCountData *pEVar1;
  Data *extraout_RDX;
  long in_FS_OFFSET;
  QSharedPointer<QIconCacheGtkReader> QVar2;
  type *ptr;
  totally_ordered_wrapper<QIconCacheGtkReader_*> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.ptr = (QIconCacheGtkReader *)&DAT_aaaaaaaaaaaaaaaa;
  pEVar1 = QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::create
                     (&local_30.ptr,
                      QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::
                      noDeleter);
  this->d = pEVar1;
  QIconCacheGtkReader::QIconCacheGtkReader(local_30.ptr,arguments);
  (this->value).ptr = local_30.ptr;
  pEVar1->destroyer =
       QtSharedPointer::ExternalRefCountWithContiguousData<QIconCacheGtkReader>::deleter;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar2.d = extraout_RDX;
    QVar2.value.ptr = (QIconCacheGtkReader *)this;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] static QSharedPointer create(Args && ...arguments)
    {
        typedef QtSharedPointer::ExternalRefCountWithContiguousData<T> Private;
# ifdef QT_SHAREDPOINTER_TRACK_POINTERS
        typename Private::DestroyerFn destroy = &Private::safetyCheckDeleter;
# else
        typename Private::DestroyerFn destroy = &Private::deleter;
# endif
        typename Private::DestroyerFn noDestroy = &Private::noDeleter;
        QSharedPointer result(Qt::Uninitialized);
        typename std::remove_cv<T>::type *ptr;
        result.d = Private::create(&ptr, noDestroy);

        // now initialize the data
        new (ptr) T(std::forward<Args>(arguments)...);
        result.value.reset(ptr);
        result.d->destroyer = destroy;
        result.d->setQObjectShared(result.value.get(), true);
# ifdef QT_SHAREDPOINTER_TRACK_POINTERS
        internalSafetyCheckAdd(result.d, result.value.get());
# endif
        result.enableSharedFromThis(result.data());
        return result;
    }